

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFunctionDecPOMDPDiscrete.cpp
# Opt level: O0

double __thiscall
ValueFunctionDecPOMDPDiscrete::CalculateVsjohRecursively<true>
          (ValueFunctionDecPOMDPDiscrete *this,Index sI,Index johI,Index stage)

{
  Index johI_00;
  JointPolicyDiscretePure *pJVar1;
  uint in_ECX;
  uint in_EDX;
  undefined4 in_ESI;
  ValueFunctionDecPOMDPDiscrete *in_RDI;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double val;
  bool valid;
  double thisSucV;
  Index sucJohI;
  double probJOI;
  Index joI;
  double probSucSI;
  Index sucSI;
  double ExpFutureR;
  double R;
  Index jaI;
  PlanningUnitDecPOMDPDiscrete *in_stack_ffffffffffffff90;
  double in_stack_ffffffffffffffa0;
  Index in_stack_ffffffffffffffa8;
  Index in_stack_ffffffffffffffac;
  ValueFunctionDecPOMDPDiscrete *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar6;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar7;
  double dVar8;
  PlanningUnitMADPDiscrete *local_8;
  
  pJVar1 = GetJPol(in_RDI);
  johI_00 = (*(pJVar1->super_JointPolicyDiscrete).super_JointPolicy._vptr_JointPolicy[0x11])
                      (pJVar1,(ulong)in_EDX);
  local_8 = (PlanningUnitMADPDiscrete *)
            PlanningUnitDecPOMDPDiscrete::GetReward
                      (in_stack_ffffffffffffff90,(Index)((ulong)in_RDI >> 0x20),(Index)in_RDI);
  dVar8 = 0.0;
  if ((ulong)in_ECX < in_RDI->_m_h - 1) {
    auVar3._0_8_ = in_stack_ffffffffffffffa0;
    for (uVar7 = 0; (ulong)uVar7 < in_RDI->_m_nrS; uVar7 = uVar7 + 1) {
      dVar2 = PlanningUnitMADPDiscrete::GetTransitionProbability
                        (&in_stack_ffffffffffffff90->super_PlanningUnitMADPDiscrete,
                         (Index)((ulong)in_RDI >> 0x20),(Index)in_RDI,0);
      for (uVar6 = 0; (ulong)uVar6 < in_RDI->_m_nrJO; uVar6 = uVar6 + 1) {
        in_stack_ffffffffffffffb0 =
             (ValueFunctionDecPOMDPDiscrete *)
             PlanningUnitMADPDiscrete::GetObservationProbability
                       (&in_stack_ffffffffffffff90->super_PlanningUnitMADPDiscrete,
                        (Index)((ulong)in_RDI >> 0x20),(Index)in_RDI,0);
        in_stack_ffffffffffffffac =
             PlanningUnitMADPDiscrete::GetSuccessorJOHI
                       (local_8,(Index)((ulong)dVar8 >> 0x20),SUB84(dVar8,0));
        GetCached((ValueFunctionDecPOMDPDiscrete *)CONCAT44(uVar7,in_stack_ffffffffffffffc8),
                  (Index)((ulong)dVar2 >> 0x20),SUB84(dVar2,0),
                  (bool *)CONCAT44(uVar6,in_stack_ffffffffffffffb8));
        auVar3._0_8_ = CalculateVsjohRecursively<true>
                                 ((ValueFunctionDecPOMDPDiscrete *)CONCAT44(in_ESI,in_EDX),in_ECX,
                                  johI_00,(Index)((ulong)local_8 >> 0x20));
        auVar3._8_8_ = 0;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = dVar8;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = dVar2 * (double)in_stack_ffffffffffffffb0;
        auVar4 = vfmadd213sd_fma(auVar3,auVar4,auVar5);
        dVar8 = auVar4._0_8_;
      }
    }
    local_8 = (PlanningUnitMADPDiscrete *)((double)local_8 + dVar8);
    SetCached(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
              auVar3._0_8_);
  }
  return (double)local_8;
}

Assistant:

double ValueFunctionDecPOMDPDiscrete::CalculateVsjohRecursively(Index sI,Index johI, Index stage)
{
#if DEBUG_CALCV
    std::cout<< "\nValueFunctionDecPOMDPDiscrete::CalculateVsjohRecursively("
             << sI << ", " << johI << ") called"<<std::endl;
#endif

    Index jaI = GetJPol()->GetJointActionIndex(johI);
    double R = _m_pu->GetReward(sI, jaI);
    double ExpFutureR = 0.0;
    // horizon h policy makes decision on observation histories which 
    // maximally have length h-1. 
    // t=0 - () - length=0 
    // ... 
    // t=h-1 - (o1,...,o{h-1}) - length h-1
    if( ( CACHED && stage >= _m_h - 1) ||
        (!CACHED && _m_pu->GetTimeStepForJOHI(johI) >= _m_h - 1 ) )
    {
#if DEBUG_CALCV
        std::cout << "ValueFunctionDecPOMDPDiscrete::CalculateVsjoh"
                  << "Recursively("<< sI <<", " << johI << ") - V="<<R<<std::endl;
#endif
        return(R);
    }

#if DEBUG_CALCV
    std::cout << "Calculating future reward"<<std::endl;
#endif
    for(Index sucSI = 0; sucSI < _m_nrS; sucSI++)
    {
        double probSucSI = _m_pu->GetTransitionProbability(sI, jaI,sucSI);
#if DEBUG_CALCV
        std::cout << "P(s"<<sucSI<<"|s"<<sI<<",ja"<<jaI<<")="<<probSucSI<<std::endl;
#endif

        for(Index joI = 0; joI < _m_nrJO; joI++)
        {
            double probJOI =  _m_pu->GetObservationProbability(jaI, sucSI, joI);
#if DEBUG_CALCV
            std::cout << "P(jo"<<joI<<"|ja"<<jaI<<",s"<<sucSI<<")="<<probJOI<<std::endl;
#endif
            Index sucJohI = _m_pu->GetSuccessorJOHI(johI, joI);

            double thisSucV;
            bool valid=false;
            if (CACHED)
                thisSucV=GetCached(sucSI,sucJohI,valid); // read from cache
            if (!valid) // if not found in cache or cache is not used
                thisSucV=CalculateVsjohRecursively<CACHED>(sucSI,sucJohI,stage+1);
            ExpFutureR += probSucSI * probJOI * thisSucV;
        }//end for each observation
    }//end for each potential succesor state
    double val = R + ExpFutureR;
    if (CACHED)
        SetCached(sI, johI, val); // write to cache
#if DEBUG_CALCV
    std::cout << "ValueFunctionDecPOMDPDiscrete::CalculateVsjohRecursively("
              << sI <<", " << johI << ") \n->immediate R="<<R
              << " \n->exp. future reward="<<ExpFutureR<<"\n->V="<<val<<std::endl;
#endif
    return(val);
}